

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

int gold_detect(obj *sobj,boolean *scr_known)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  long lVar6;
  monst *pmVar7;
  uint material;
  undefined1 local_1b0 [8];
  obj gold;
  char buf [256];
  boolean stale;
  obj *temp;
  monst *pmStack_30;
  int uw;
  monst *mtmp;
  obj *obj;
  boolean *scr_known_local;
  obj *sobj_local;
  
  bVar1 = (byte)u._1052_1_ >> 1 & 1;
  material = 0;
  if ((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0) {
    material = 0xf;
  }
  bVar2 = clear_stale_map('\f',material);
  *scr_known = bVar2;
  for (pmStack_30 = level->monlist; pmStack_30 != (monst *)0x0; pmStack_30 = pmStack_30->nmon) {
    if (0 < pmStack_30->mhp) {
      poVar4 = findgold(pmStack_30->minvent);
      if ((poVar4 != (obj *)0x0) || (iVar3 = monsndx(pmStack_30->data), iVar3 == 0x103)) {
        *scr_known = '\x01';
        goto LAB_0017b420;
      }
      for (mtmp = (monst *)pmStack_30->minvent; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
        if (((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0) &&
           (poVar4 = o_material((obj *)mtmp,0xf), poVar4 != (obj *)0x0)) {
          *scr_known = '\x01';
          goto LAB_0017b420;
        }
        poVar4 = o_in((obj *)mtmp,'\f');
        if (poVar4 != (obj *)0x0) {
          *scr_known = '\x01';
          goto LAB_0017b420;
        }
      }
    }
  }
  mtmp = (monst *)level->objlist;
  do {
    if (mtmp == (monst *)0x0) {
      if (*scr_known == '\0') {
        if (youmonst.data == mons + 0x103) {
          pcVar5 = currency(2);
          sprintf((char *)&gold.owornmask,"You feel like a million %s!",pcVar5);
        }
        else {
          lVar6 = hidden_gold();
          if ((lVar6 == 0) && (lVar6 = money_cnt(invent), lVar6 == 0)) {
            strcpy((char *)&gold.owornmask,"You feel materially poor.");
          }
          else {
            strcpy((char *)&gold.owornmask,"You feel worried about your future financial situation."
                  );
          }
        }
        strange_feeling(sobj,(char *)&gold.owornmask);
        sobj_local._4_4_ = 1;
      }
      else {
        if (bVar2 != '\0') {
          doredraw();
        }
        pcVar5 = body_part(5);
        pcVar5 = makeplural(pcVar5);
        pline("You notice some gold between your %s.",pcVar5);
        sobj_local._4_4_ = 0;
      }
      return sobj_local._4_4_;
    }
    if (((*(uint *)&sobj->field_0x4a >> 1 & 1) == 0) ||
       (poVar4 = o_material((obj *)mtmp,0xf), poVar4 == (obj *)0x0)) {
      poVar4 = o_in((obj *)mtmp,'\f');
      if ((poVar4 != (obj *)0x0) &&
         ((*scr_known = '\x01', (char)mtmp->m_id != u.ux ||
          (*(char *)((long)&mtmp->m_id + 1) != u.uy)))) goto LAB_0017b420;
    }
    else {
      *scr_known = '\x01';
      if (((char)mtmp->m_id != u.ux) || (*(char *)((long)&mtmp->m_id + 1) != u.uy)) {
LAB_0017b420:
        cls();
        u._1052_1_ = u._1052_1_ & 0xfd;
        for (mtmp = (monst *)level->objlist; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
          if (((*(uint *)&sobj->field_0x4a >> 1 & 1) == 0) ||
             (pmVar7 = (monst *)o_material((obj *)mtmp,0xf), pmVar7 == (monst *)0x0)) {
            pmVar7 = (monst *)o_in((obj *)mtmp,'\f');
            if (pmVar7 != (monst *)0x0) {
              if (pmVar7 != mtmp) {
                *(xchar *)&pmVar7->m_id = (xchar)mtmp->m_id;
                *(xchar *)((long)&pmVar7->m_id + 1) = *(xchar *)((long)&mtmp->m_id + 1);
              }
              map_object((obj *)pmVar7,1);
            }
          }
          else {
            if (pmVar7 != mtmp) {
              *(xchar *)&pmVar7->m_id = (xchar)mtmp->m_id;
              *(xchar *)((long)&pmVar7->m_id + 1) = *(xchar *)((long)&mtmp->m_id + 1);
            }
            map_object((obj *)pmVar7,1);
          }
        }
        pmStack_30 = level->monlist;
        do {
          if (pmStack_30 == (monst *)0x0) {
            newsym((int)u.ux,(int)u.uy);
            pline("You feel very greedy, and sense gold!");
            exercise(2,'\x01');
            (*windowprocs.win_pause)(P_MAP);
            doredraw();
            u._1052_1_ = u._1052_1_ & 0xfd | bVar1 << 1;
            if (bVar1 != 0) {
              under_water(2);
            }
            if (((byte)u._1052_1_ >> 5 & 1) != 0) {
              under_ground(2);
            }
            return 0;
          }
          if (0 < pmStack_30->mhp) {
            poVar4 = findgold(pmStack_30->minvent);
            if ((poVar4 == (obj *)0x0) && (iVar3 = monsndx(pmStack_30->data), iVar3 != 0x103)) {
              for (mtmp = (monst *)pmStack_30->minvent; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
                if (((*(uint *)&sobj->field_0x4a >> 1 & 1) != 0) &&
                   (poVar4 = o_material((obj *)mtmp,0xf), poVar4 != (obj *)0x0)) {
                  poVar4->ox = pmStack_30->mx;
                  poVar4->oy = pmStack_30->my;
                  map_object(poVar4,1);
                  break;
                }
                poVar4 = o_in((obj *)mtmp,'\f');
                if (poVar4 != (obj *)0x0) {
                  poVar4->ox = pmStack_30->mx;
                  poVar4->oy = pmStack_30->my;
                  map_object(poVar4,1);
                  break;
                }
              }
            }
            else {
              memcpy(local_1b0,&zeroobj,0x68);
              gold.olev._2_2_ = 0x1ef;
              gold.olev._0_1_ = pmStack_30->mx;
              gold.olev._1_1_ = pmStack_30->my;
              map_object((obj *)local_1b0,1);
            }
          }
          pmStack_30 = pmStack_30->nmon;
        } while( true );
      }
    }
    mtmp = mtmp->nmon;
  } while( true );
}

Assistant:

int gold_detect(struct obj *sobj, boolean *scr_known)
{
    struct obj *obj;
    struct monst *mtmp;
    int uw = u.uinwater;
    struct obj *temp;
    boolean stale;

    *scr_known = stale = clear_stale_map(COIN_CLASS, sobj->blessed ? GOLD : 0);

    /* look for gold carried by monsters (might be in a container) */
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably not needed in this case but... */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    *scr_known = TRUE;
	    goto outgoldmap;	/* skip further searching */
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && o_material(obj, GOLD)) {
	    	*scr_known = TRUE;
	    	goto outgoldmap;
	    } else if (o_in(obj, COIN_CLASS)) {
		*scr_known = TRUE;
		goto outgoldmap;	/* skip further searching */
	    }
    }
    
    /* look for gold objects */
    for (obj = level->objlist; obj; obj = obj->nobj) {
	if (sobj->blessed && o_material(obj, GOLD)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	} else if (o_in(obj, COIN_CLASS)) {
	    *scr_known = TRUE;
	    if (obj->ox != u.ux || obj->oy != u.uy) goto outgoldmap;
	}
    }

    if (!*scr_known) {
	/* no gold found on floor or monster's inventory.
	   adjust message if you have gold in your inventory */
	char buf[BUFSZ];
	if (youmonst.data == &mons[PM_GOLD_GOLEM]) {
		sprintf(buf, "You feel like a million %s!", currency(2L));
	} else if (hidden_gold() || money_cnt(invent))
		strcpy(buf, "You feel worried about your future financial situation.");
	else
		strcpy(buf, "You feel materially poor.");
	strange_feeling(sobj, buf);
	return 1;
    }
    /* only under me - no separate display required */
    if (stale) doredraw();
    pline("You notice some gold between your %s.", makeplural(body_part(FOOT)));
    return 0;

outgoldmap:
    cls();

    u.uinwater = 0;
    /* Discover gold locations. */
    for (obj = level->objlist; obj; obj = obj->nobj) {
    	if (sobj->blessed && (temp = o_material(obj, GOLD))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	} else if ((temp = o_in(obj, COIN_CLASS))) {
	    if (temp != obj) {
		temp->ox = obj->ox;
		temp->oy = obj->oy;
	    }
	    map_object(temp,1);
	}
    }
    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
    	if (DEADMONSTER(mtmp)) continue;	/* probably overkill here */
	if (findgold(mtmp->minvent) || monsndx(mtmp->data) == PM_GOLD_GOLEM) {
	    struct obj gold;
	    gold = zeroobj;
	    gold.otyp = GOLD_PIECE;
	    gold.ox = mtmp->mx;
	    gold.oy = mtmp->my;
	    map_object(&gold,1);
	} else for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (sobj->blessed && (temp = o_material(obj, GOLD))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    } else if ((temp = o_in(obj, COIN_CLASS))) {
		temp->ox = mtmp->mx;
		temp->oy = mtmp->my;
		map_object(temp,1);
		break;
	    }
    }
    
    newsym(u.ux,u.uy);
    pline("You feel very greedy, and sense gold!");
    exercise(A_WIS, TRUE);
    win_pause_output(P_MAP);
    doredraw();
    u.uinwater = uw;
    if (Underwater) under_water(2);
    if (u.uburied) under_ground(2);
    return 0;
}